

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  uint uVar21;
  int iVar22;
  undefined4 uVar23;
  ulong unaff_RBX;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  vint4 bi_2;
  undefined1 auVar31 [64];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_2;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_7;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_4;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vfloat<4> tNear;
  vint4 bi;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar34._4_4_ = fVar2;
  auVar34._0_4_ = fVar2;
  auVar34._8_4_ = fVar2;
  auVar34._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar37._4_4_ = fVar3;
  auVar37._0_4_ = fVar3;
  auVar37._8_4_ = fVar3;
  auVar37._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar46._4_4_ = fVar7;
  auVar46._0_4_ = fVar7;
  auVar46._8_4_ = fVar7;
  auVar46._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar48._4_4_ = fVar8;
  auVar48._0_4_ = fVar8;
  auVar48._8_4_ = fVar8;
  auVar48._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar49._4_4_ = fVar9;
  auVar49._0_4_ = fVar9;
  auVar49._8_4_ = fVar9;
  auVar49._12_4_ = fVar9;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar22 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar22;
  auVar50._0_4_ = iVar22;
  auVar50._8_4_ = iVar22;
  auVar50._12_4_ = iVar22;
  iVar22 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT1664(CONCAT412(iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22))));
  auVar52._0_4_ = fVar7 * -fVar1;
  auVar52._4_4_ = fVar7 * -fVar1;
  auVar52._8_4_ = fVar7 * -fVar1;
  auVar52._12_4_ = fVar7 * -fVar1;
  auVar54._0_4_ = fVar8 * -fVar2;
  auVar54._4_4_ = fVar8 * -fVar2;
  auVar54._8_4_ = fVar8 * -fVar2;
  auVar54._12_4_ = fVar8 * -fVar2;
  auVar55._0_4_ = fVar9 * -fVar3;
  auVar55._4_4_ = fVar9 * -fVar3;
  auVar55._8_4_ = fVar9 * -fVar3;
  auVar55._12_4_ = fVar9 * -fVar3;
  do {
    do {
      if (pSVar30 == stack) {
        return;
      }
      pSVar20 = pSVar30 + -1;
      pSVar30 = pSVar30 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar20->dist);
    sVar27 = (pSVar30->ptr).ptr;
    do {
      if ((sVar27 & 0xf) == 0) {
        auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + uVar24),auVar52,auVar46);
        auVar36 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + uVar28),auVar54,auVar48);
        auVar33 = vpmaxsd_avx(auVar33,auVar36);
        auVar36 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + uVar29),auVar55,auVar49);
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar24 ^ 0x10)),auVar52,
                                  auVar46);
        auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar28 ^ 0x10)),auVar54,
                                  auVar48);
        auVar32 = vpminsd_avx(auVar32,auVar38);
        auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar27 + 0x20 + (uVar29 ^ 0x10)),auVar55,
                                  auVar49);
        auVar36 = vpmaxsd_avx(auVar36,auVar50);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar33,auVar36);
        auVar33 = vpminsd_avx(auVar38,auVar31._0_16_);
        auVar33 = vpminsd_avx(auVar32,auVar33);
        auVar33 = vpcmpgtd_avx((undefined1  [16])tNear.field_0,auVar33);
        uVar21 = vmovmskps_avx(auVar33);
        unaff_RBX = ((ulong)uVar21 ^ 0xf) & 0xff;
LAB_0058ba1e:
        bVar19 = true;
      }
      else {
        if ((int)(sVar27 & 0xf) == 2) {
          uVar25 = sVar27 & 0xfffffffffffffff0;
          auVar33 = *(undefined1 (*) [16])(uVar25 + 0x80);
          auVar47._0_4_ = fVar6 * auVar33._0_4_;
          auVar47._4_4_ = fVar6 * auVar33._4_4_;
          auVar47._8_4_ = fVar6 * auVar33._8_4_;
          auVar47._12_4_ = fVar6 * auVar33._12_4_;
          auVar36 = *(undefined1 (*) [16])(uVar25 + 0x90);
          auVar51._0_4_ = fVar6 * auVar36._0_4_;
          auVar51._4_4_ = fVar6 * auVar36._4_4_;
          auVar51._8_4_ = fVar6 * auVar36._8_4_;
          auVar51._12_4_ = fVar6 * auVar36._12_4_;
          auVar32 = *(undefined1 (*) [16])(uVar25 + 0xa0);
          auVar53._0_4_ = fVar6 * auVar32._0_4_;
          auVar53._4_4_ = fVar6 * auVar32._4_4_;
          auVar53._8_4_ = fVar6 * auVar32._8_4_;
          auVar53._12_4_ = fVar6 * auVar32._12_4_;
          auVar16._4_4_ = uVar5;
          auVar16._0_4_ = uVar5;
          auVar16._8_4_ = uVar5;
          auVar16._12_4_ = uVar5;
          auVar38 = vfmadd231ps_fma(auVar47,auVar16,*(undefined1 (*) [16])(uVar25 + 0x50));
          auVar47 = vfmadd231ps_fma(auVar51,auVar16,*(undefined1 (*) [16])(uVar25 + 0x60));
          auVar17._4_4_ = uVar4;
          auVar17._0_4_ = uVar4;
          auVar17._8_4_ = uVar4;
          auVar17._12_4_ = uVar4;
          auVar45 = vfmadd231ps_fma(auVar38,auVar17,*(undefined1 (*) [16])(uVar25 + 0x20));
          auVar43 = vfmadd231ps_fma(auVar47,auVar17,*(undefined1 (*) [16])(uVar25 + 0x30));
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar56,auVar45);
          auVar40._8_4_ = 0x219392ef;
          auVar40._0_8_ = 0x219392ef219392ef;
          auVar40._12_4_ = 0x219392ef;
          auVar38 = vcmpps_avx(auVar38,auVar40,1);
          auVar47 = vblendvps_avx(auVar45,auVar40,auVar38);
          auVar38 = vandps_avx(auVar43,auVar56);
          auVar38 = vcmpps_avx(auVar38,auVar40,1);
          auVar45 = vblendvps_avx(auVar43,auVar40,auVar38);
          auVar38 = vfmadd231ps_fma(auVar53,auVar16,*(undefined1 (*) [16])(uVar25 + 0x70));
          auVar43 = vfmadd231ps_fma(auVar38,auVar17,*(undefined1 (*) [16])(uVar25 + 0x40));
          auVar38 = vandps_avx(auVar43,auVar56);
          auVar38 = vcmpps_avx(auVar38,auVar40,1);
          auVar38 = vblendvps_avx(auVar43,auVar40,auVar38);
          auVar43 = vrcpps_avx(auVar47);
          auVar41._8_4_ = 0x3f800000;
          auVar41._0_8_ = &DAT_3f8000003f800000;
          auVar41._12_4_ = 0x3f800000;
          auVar47 = vfnmadd213ps_fma(auVar47,auVar43,auVar41);
          auVar43 = vfmadd132ps_fma(auVar47,auVar43,auVar43);
          auVar47 = vrcpps_avx(auVar45);
          auVar45 = vfnmadd213ps_fma(auVar45,auVar47,auVar41);
          auVar45 = vfmadd132ps_fma(auVar45,auVar47,auVar47);
          auVar47 = vrcpps_avx(auVar38);
          auVar16 = vfnmadd213ps_fma(auVar38,auVar47,auVar41);
          auVar38 = vfmadd213ps_fma(auVar33,auVar37,*(undefined1 (*) [16])(uVar25 + 0xb0));
          auVar33 = vfmadd132ps_fma(auVar16,auVar47,auVar47);
          auVar38 = vfmadd231ps_fma(auVar38,auVar34,*(undefined1 (*) [16])(uVar25 + 0x50));
          auVar36 = vfmadd213ps_fma(auVar36,auVar37,*(undefined1 (*) [16])(uVar25 + 0xc0));
          auVar47 = vfmadd231ps_fma(auVar36,auVar34,*(undefined1 (*) [16])(uVar25 + 0x60));
          auVar36 = vfmadd213ps_fma(auVar32,auVar37,*(undefined1 (*) [16])(uVar25 + 0xd0));
          auVar36 = vfmadd231ps_fma(auVar36,auVar34,*(undefined1 (*) [16])(uVar25 + 0x70));
          auVar18._4_4_ = fVar1;
          auVar18._0_4_ = fVar1;
          auVar18._8_4_ = fVar1;
          auVar18._12_4_ = fVar1;
          auVar32 = vfmadd231ps_fma(auVar38,auVar18,*(undefined1 (*) [16])(uVar25 + 0x20));
          auVar38._0_4_ = auVar32._0_4_ * -auVar43._0_4_;
          auVar38._4_4_ = auVar32._4_4_ * -auVar43._4_4_;
          auVar38._8_4_ = auVar32._8_4_ * -auVar43._8_4_;
          auVar38._12_4_ = auVar32._12_4_ * -auVar43._12_4_;
          auVar32 = vfmadd231ps_fma(auVar47,auVar18,*(undefined1 (*) [16])(uVar25 + 0x30));
          auVar35._0_4_ = auVar32._0_4_ * -auVar45._0_4_;
          auVar35._4_4_ = auVar32._4_4_ * -auVar45._4_4_;
          auVar35._8_4_ = auVar32._8_4_ * -auVar45._8_4_;
          auVar35._12_4_ = auVar32._12_4_ * -auVar45._12_4_;
          auVar36 = vfmadd231ps_fma(auVar36,auVar18,*(undefined1 (*) [16])(uVar25 + 0x40));
          auVar32._0_4_ = auVar36._0_4_ * -auVar33._0_4_;
          auVar32._4_4_ = auVar36._4_4_ * -auVar33._4_4_;
          auVar32._8_4_ = auVar36._8_4_ * -auVar33._8_4_;
          auVar32._12_4_ = auVar36._12_4_ * -auVar33._12_4_;
          auVar42._0_4_ = auVar43._0_4_ + auVar38._0_4_;
          auVar42._4_4_ = auVar43._4_4_ + auVar38._4_4_;
          auVar42._8_4_ = auVar43._8_4_ + auVar38._8_4_;
          auVar42._12_4_ = auVar43._12_4_ + auVar38._12_4_;
          auVar43._0_4_ = auVar45._0_4_ + auVar35._0_4_;
          auVar43._4_4_ = auVar45._4_4_ + auVar35._4_4_;
          auVar43._8_4_ = auVar45._8_4_ + auVar35._8_4_;
          auVar43._12_4_ = auVar45._12_4_ + auVar35._12_4_;
          auVar45._0_4_ = auVar33._0_4_ + auVar32._0_4_;
          auVar45._4_4_ = auVar33._4_4_ + auVar32._4_4_;
          auVar45._8_4_ = auVar33._8_4_ + auVar32._8_4_;
          auVar45._12_4_ = auVar33._12_4_ + auVar32._12_4_;
          auVar33 = vpminsd_avx(auVar35,auVar43);
          auVar36 = vpminsd_avx(auVar32,auVar45);
          auVar33 = vmaxps_avx(auVar33,auVar36);
          auVar47 = vpminsd_avx(auVar38,auVar42);
          auVar38 = vpmaxsd_avx(auVar38,auVar42);
          auVar36 = vpmaxsd_avx(auVar35,auVar43);
          auVar32 = vpmaxsd_avx(auVar32,auVar45);
          auVar32 = vminps_avx(auVar36,auVar32);
          auVar36 = vmaxps_avx(auVar50,auVar47);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar36,auVar33)
          ;
          auVar33 = vminps_avx(auVar31._0_16_,auVar38);
          auVar33 = vminps_avx(auVar33,auVar32);
          auVar33 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar33,2);
          uVar23 = vmovmskps_avx(auVar33);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar23);
          goto LAB_0058ba1e;
        }
        bVar19 = false;
      }
      if (bVar19) {
        if (unaff_RBX == 0) {
          iVar22 = 4;
        }
        else {
          uVar26 = sVar27 & 0xfffffffffffffff0;
          lVar14 = 0;
          for (uVar25 = unaff_RBX; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          iVar22 = 0;
          uVar25 = unaff_RBX - 1 & unaff_RBX;
          sVar27 = *(ulong *)(uVar26 + lVar14 * 8);
          if (uVar25 != 0) {
            uVar21 = tNear.field_0.i[lVar14];
            lVar14 = 0;
            for (uVar15 = uVar25; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            uVar25 = uVar25 - 1 & uVar25;
            uVar15 = *(ulong *)(uVar26 + lVar14 * 8);
            uVar10 = tNear.field_0.i[lVar14];
            if (uVar25 == 0) {
              if (uVar21 < uVar10) {
                (pSVar30->ptr).ptr = uVar15;
                pSVar30->dist = uVar10;
                pSVar30 = pSVar30 + 1;
              }
              else {
                (pSVar30->ptr).ptr = sVar27;
                pSVar30->dist = uVar21;
                sVar27 = uVar15;
                pSVar30 = pSVar30 + 1;
              }
            }
            else {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = sVar27;
              auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar21));
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar15;
              auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar10));
              lVar14 = 0;
              for (uVar15 = uVar25; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar14 = lVar14 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)(uVar26 + lVar14 * 8);
              auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416((uint)tNear.field_0.i[lVar14]));
              auVar32 = vpcmpgtd_avx(auVar36,auVar33);
              if (uVar25 == 0) {
                auVar47 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar36,auVar33,auVar47);
                auVar33 = vblendvps_avx(auVar33,auVar36,auVar47);
                auVar36 = vpcmpgtd_avx(auVar38,auVar32);
                auVar47 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar38,auVar32,auVar47);
                auVar32 = vblendvps_avx(auVar32,auVar38,auVar47);
                auVar38 = vpcmpgtd_avx(auVar32,auVar33);
                auVar38 = vpshufd_avx(auVar38,0xaa);
                SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar32,auVar33,auVar38);
                SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar32,auVar38);
                *pSVar30 = SVar12;
                pSVar30[1] = SVar11;
                sVar27 = auVar36._0_8_;
                pSVar30 = pSVar30 + 2;
              }
              else {
                lVar14 = 0;
                for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                  lVar14 = lVar14 + 1;
                }
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *(ulong *)(uVar26 + lVar14 * 8);
                auVar45 = vpunpcklqdq_avx(auVar44,ZEXT416((uint)tNear.field_0.i[lVar14]));
                auVar47 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar36,auVar33,auVar47);
                auVar33 = vblendvps_avx(auVar33,auVar36,auVar47);
                auVar36 = vpcmpgtd_avx(auVar45,auVar38);
                auVar47 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar45,auVar38,auVar47);
                auVar38 = vblendvps_avx(auVar38,auVar45,auVar47);
                auVar47 = vpcmpgtd_avx(auVar38,auVar33);
                auVar45 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar38,auVar33,auVar45);
                SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar38,auVar45);
                auVar33 = vpcmpgtd_avx(auVar36,auVar32);
                auVar38 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar36,auVar32,auVar38);
                auVar36 = vblendvps_avx(auVar32,auVar36,auVar38);
                auVar32 = vpcmpgtd_avx(auVar47,auVar36);
                auVar32 = vpshufd_avx(auVar32,0xaa);
                SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar47,auVar36,auVar32);
                SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar36,auVar47,auVar32);
                *pSVar30 = SVar11;
                pSVar30[1] = SVar13;
                pSVar30[2] = SVar12;
                sVar27 = auVar33._0_8_;
                pSVar30 = pSVar30 + 3;
              }
            }
          }
        }
      }
      else {
        iVar22 = 6;
      }
    } while (iVar22 == 0);
    if (iVar22 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(sVar27 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      uVar23 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31 = ZEXT1664(CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))));
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }